

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerBailoutCheckAndLabel(Lowerer *this,Instr *instr,bool onEqual,bool isHelper)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  OpCode assignOpcode;
  BailOutKind BVar5;
  LabelInstr *pLVar6;
  undefined4 *puVar7;
  Opnd *pOVar8;
  Opnd *compareSrc2;
  Lowerer *this_00;
  
  pLVar6 = (LabelInstr *)instr->m_next;
  IVar1 = (pLVar6->super_Instr).m_kind;
  if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
    pLVar6 = IR::LabelInstr::New(Label,this->m_func,isHelper);
    IR::Instr::InsertAfter(instr,&pLVar6->super_Instr);
  }
  BVar5 = IR::Instr::GetBailOutKind(instr);
  if (BVar5 == BailOutInjected) {
    if (!onEqual) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315d,"(onEqual)","onEqual");
      if (!bVar3) goto LAB_005e2c4d;
      *puVar7 = 0;
    }
    bVar3 = IR::Opnd::IsEqual(instr->m_src1,instr->m_src2);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315e,"(instr->GetSrc1()->IsEqual(instr->GetSrc2()))",
                         "instr->GetSrc1()->IsEqual(instr->GetSrc2())");
      if (!bVar3) goto LAB_005e2c4d;
      *puVar7 = 0;
    }
    pOVar8 = instr->m_src1;
    OVar4 = IR::Opnd::GetKind(pOVar8);
    if (OVar4 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar3) goto LAB_005e2c4d;
      *puVar7 = 0;
    }
    if (pOVar8[1]._vptr_Opnd != (_func_int **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315f,"(instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0)",
                         "instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0");
      if (!bVar3) {
LAB_005e2c4d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    assignOpcode = LowererMDArch::GetAssignOp(instr->m_src1->m_type);
    IR::Instr::HoistSrc1(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
  }
  pOVar8 = IR::Instr::UnlinkSrc1(instr);
  this_00 = (Lowerer *)instr;
  compareSrc2 = IR::Instr::UnlinkSrc2(instr);
  InsertCompareBranch(this_00,pOVar8,compareSrc2,onEqual | BrEq_A,false,pLVar6,instr,false);
  if (!isHelper) {
    pLVar6 = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(instr,&pLVar6->super_Instr);
    (pLVar6->super_Instr).m_noLazyHelperAssert = true;
  }
  return;
}

Assistant:

void
Lowerer::LowerBailoutCheckAndLabel(IR::Instr *instr, bool onEqual, bool isHelper)
{
    // Label to skip Bailout and continue
    IR::LabelInstr * continueLabelInstr;
    IR::Instr *instrNext = instr->m_next;
    if (instrNext->IsLabelInstr())
    {
        continueLabelInstr = instrNext->AsLabelInstr();
    }
    else
    {
        continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
        instr->InsertAfter(continueLabelInstr);
    }

    if(instr->GetBailOutKind() == IR::BailOutInjected)
    {
        // BailOnEqual 0, 0
        Assert(onEqual);
        Assert(instr->GetSrc1()->IsEqual(instr->GetSrc2()));
        Assert(instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0);

        // The operands cannot be equal when generating a compare (assert) but since this is for testing purposes, hoist a src.
        // Ideally, we would just create a BailOut instruction that generates a guaranteed bailout, but there seem to be issues
        // with doing this in a non-helper path. So finally, it would generate:
        //     xor s0, s0
        //     test s0, s0
        //     jnz $continue
        //   $bailout:
        //     // bailout
        //   $continue:
        instr->HoistSrc1(LowererMD::GetLoadOp(instr->GetSrc1()->GetType()));
    }

    InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(),
        onEqual ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, continueLabelInstr, instr);

    if (!isHelper)
    {
        IR::LabelInstr * helperLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        instr->InsertBefore(helperLabelInstr);
#if DBG
        helperLabelInstr->m_noLazyHelperAssert = true;
#endif
    }
}